

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_x_mn12.c
# Opt level: O3

void mgga_x_mn12_init(xc_func_type *p)

{
  int iVar1;
  void *pvVar2;
  
  pvVar2 = malloc(0x140);
  p->params = pvVar2;
  iVar1 = p->info->number;
  if ((iVar1 != 0x154) && (iVar1 != 0x10c)) {
    if (iVar1 == 0xf8) {
      xc_hyb_init_cam(p,0.0,0.0,0.0);
      return;
    }
    return;
  }
  xc_hyb_init_hybrid(p,0.0);
  return;
}

Assistant:

static void
mgga_x_mn12_init(xc_func_type *p)
{
  assert(p->params == NULL);
  p->params = libxc_malloc(sizeof(mgga_x_mn12_params));

  if(p->info->number == XC_HYB_MGGA_X_MN12_SX)
    xc_hyb_init_cam(p, 0.0, 0.0, 0.0);
  else if(p->info->number == XC_HYB_MGGA_X_MN15)
    xc_hyb_init_hybrid(p, 0.0);
  else if(p->info->number == XC_HYB_MGGA_X_CF22D)
    xc_hyb_init_hybrid(p, 0.0);
}